

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# output_script.cpp
# Opt level: O3

RPCHelpMan * getdescriptorinfo(void)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  ulong *puVar2;
  string name;
  string m_key_name;
  string m_key_name_00;
  string m_key_name_01;
  string m_key_name_02;
  string m_key_name_03;
  string m_key_name_04;
  string m_key_name_05;
  RPCResult result;
  string description;
  string description_00;
  string description_01;
  string description_02;
  string description_03;
  string description_04;
  string description_05;
  string description_06;
  string description_07;
  Fallback fallback;
  vector<RPCResult,_std::allocator<RPCResult>_> inner;
  vector<RPCResult,_std::allocator<RPCResult>_> inner_00;
  vector<RPCResult,_std::allocator<RPCResult>_> inner_01;
  vector<RPCResult,_std::allocator<RPCResult>_> inner_02;
  vector<RPCResult,_std::allocator<RPCResult>_> inner_03;
  vector<RPCResult,_std::allocator<RPCResult>_> inner_04;
  vector<RPCResult,_std::allocator<RPCResult>_> inner_05;
  vector<RPCResult,_std::allocator<RPCResult>_> inner_06;
  vector<RPCArg,_std::allocator<RPCArg>_> args;
  RPCResults results;
  RPCExamples examples;
  string description_08;
  RPCArgOptions opts;
  undefined1 auVar3 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar4;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar5;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar6;
  long lVar7;
  RPCHelpMan *in_RDI;
  undefined8 uVar8;
  long in_FS_OFFSET;
  initializer_list<RPCArg> __l;
  initializer_list<RPCResult> __l_00;
  initializer_list<RPCResult> __l_01;
  string EXAMPLE_DESCRIPTOR;
  undefined4 in_stack_fffffffffffff478;
  undefined4 uVar9;
  undefined4 in_stack_fffffffffffff47c;
  undefined8 in_stack_fffffffffffff488;
  undefined8 in_stack_fffffffffffff490;
  undefined8 in_stack_fffffffffffff498;
  code *pcVar10;
  undefined8 in_stack_fffffffffffff4a0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  in_stack_fffffffffffff4a8;
  pointer in_stack_fffffffffffff4b8;
  pointer pRVar11;
  pointer in_stack_fffffffffffff4c0;
  pointer pRVar12;
  pointer in_stack_fffffffffffff4c8;
  pointer pRVar13;
  undefined8 in_stack_fffffffffffff4d0;
  pointer in_stack_fffffffffffff4d8;
  pointer pRVar14;
  pointer in_stack_fffffffffffff4e0;
  pointer pRVar15;
  pointer in_stack_fffffffffffff4e8;
  pointer pRVar16;
  undefined8 in_stack_fffffffffffff4f0;
  pointer in_stack_fffffffffffff4f8;
  pointer pRVar17;
  pointer in_stack_fffffffffffff500;
  pointer pRVar18;
  pointer in_stack_fffffffffffff508;
  undefined8 in_stack_fffffffffffff510;
  pointer in_stack_fffffffffffff518;
  pointer in_stack_fffffffffffff520;
  pointer in_stack_fffffffffffff528;
  undefined8 in_stack_fffffffffffff530;
  pointer in_stack_fffffffffffff538;
  pointer in_stack_fffffffffffff540;
  pointer in_stack_fffffffffffff548;
  undefined1 in_stack_fffffffffffff550 [16];
  vector<RPCResult,_std::allocator<RPCResult>_> local_a98;
  vector<RPCResult,_std::allocator<RPCResult>_> local_a78;
  RPCResults local_a60;
  allocator_type local_a41;
  vector<RPCArg,_std::allocator<RPCArg>_> local_a40;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a28;
  string local_a08;
  string local_9e8;
  string local_9c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_9a8;
  string local_988;
  string local_968;
  string local_948;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_928;
  ulong *local_908;
  undefined8 local_900;
  ulong local_8f8;
  undefined8 uStack_8f0;
  ulong *local_8e8;
  size_type local_8e0;
  ulong local_8d8;
  undefined8 uStack_8d0;
  long *local_8c8 [2];
  long local_8b8 [2];
  long *local_8a8 [2];
  long local_898 [2];
  long *local_888 [2];
  long local_878 [2];
  long *local_868 [2];
  long local_858 [2];
  long *local_848 [2];
  long local_838 [2];
  long *local_828 [2];
  long local_818 [2];
  long *local_808 [2];
  long local_7f8 [2];
  long *local_7e8 [2];
  long local_7d8 [2];
  long *local_7c8 [2];
  long local_7b8 [2];
  long *local_7a8 [2];
  long local_798 [2];
  RPCResult local_788;
  long *local_700 [2];
  long local_6f0 [2];
  vector<RPCResult,_std::allocator<RPCResult>_> local_6e0;
  long *local_6c0 [2];
  long local_6b0 [2];
  pointer local_6a0 [2];
  undefined1 local_690 [152];
  RPCResult local_5f8;
  RPCResult local_570;
  RPCResult local_4e8;
  RPCResult local_460;
  RPCResult local_3d8;
  long *local_350 [2];
  long local_340 [2];
  long *local_330 [2];
  long local_320 [2];
  RPCResult local_310;
  undefined1 local_288;
  undefined1 *local_280;
  undefined8 local_278;
  undefined1 local_270;
  undefined7 uStack_26f;
  undefined1 local_260 [32];
  long *local_240 [2];
  long local_230 [2];
  _Variadic_union<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  local_220;
  undefined1 local_1c8;
  long *local_1c0 [2];
  long local_1b0 [2];
  RPCArg local_1a0;
  long *local_98 [2];
  long local_88 [2];
  _Any_data local_78;
  _Manager_type local_68 [2];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_58,
             "wpkh([d34db33f/84h/0h/0h]0279be667ef9dcbbac55a06295Ce870b07029Bfcdb2dce28d959f2815b16f81798)"
             ,"");
  local_78._M_unused._M_object = local_68;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_78,"getdescriptorinfo","");
  local_98[0] = local_88;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_98,"\nAnalyses a descriptor.\n","");
  local_1c0[0] = local_1b0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1c0,"descriptor","");
  local_220._M_first._M_storage = (_Uninitialized<RPCArg::Optional,_true>)NO;
  local_1c8 = 0;
  local_240[0] = local_230;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_240,"The descriptor.","");
  local_288 = 0;
  local_278 = 0;
  local_270 = 0;
  local_260._0_8_ = (pointer)0x0;
  local_260._8_2_ = 0;
  local_260._10_6_ = 0;
  local_260._16_2_ = 0;
  local_260._18_8_ = 0;
  name._M_dataplus._M_p._4_4_ = in_stack_fffffffffffff47c;
  name._M_dataplus._M_p._0_4_ = in_stack_fffffffffffff478;
  name._M_string_length = (size_type)in_RDI;
  name.field_2._M_allocated_capacity = in_stack_fffffffffffff488;
  name.field_2._8_8_ = in_stack_fffffffffffff490;
  fallback.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _8_8_ = in_stack_fffffffffffff4a0;
  fallback.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _0_8_ = in_stack_fffffffffffff498;
  fallback.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _16_16_ = (undefined1  [16])in_stack_fffffffffffff4a8;
  fallback.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _32_8_ = in_stack_fffffffffffff4b8;
  fallback.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _40_8_ = in_stack_fffffffffffff4c0;
  fallback.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _48_8_ = in_stack_fffffffffffff4c8;
  fallback.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _56_8_ = in_stack_fffffffffffff4d0;
  fallback.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _64_8_ = in_stack_fffffffffffff4d8;
  fallback.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _72_8_ = in_stack_fffffffffffff4e0;
  fallback.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _80_8_ = in_stack_fffffffffffff4e8;
  fallback.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._88_8_
       = in_stack_fffffffffffff4f0;
  description_08._M_string_length = (size_type)in_stack_fffffffffffff500;
  description_08._M_dataplus._M_p = (pointer)in_stack_fffffffffffff4f8;
  description_08.field_2._M_allocated_capacity = (size_type)in_stack_fffffffffffff508;
  description_08.field_2._8_8_ = in_stack_fffffffffffff510;
  opts.oneline_description._M_dataplus._M_p = (pointer)in_stack_fffffffffffff520;
  opts._0_8_ = in_stack_fffffffffffff518;
  opts.oneline_description._M_string_length = (size_type)in_stack_fffffffffffff528;
  opts.oneline_description.field_2._M_allocated_capacity = in_stack_fffffffffffff530;
  opts.oneline_description.field_2._8_8_ = in_stack_fffffffffffff538;
  opts.type_str.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)in_stack_fffffffffffff540;
  opts.type_str.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)in_stack_fffffffffffff548;
  opts.type_str.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)in_stack_fffffffffffff550._0_8_;
  opts.hidden = (bool)in_stack_fffffffffffff550[8];
  opts.also_positional = (bool)in_stack_fffffffffffff550[9];
  opts._66_6_ = in_stack_fffffffffffff550._10_6_;
  local_280 = &local_270;
  RPCArg::RPCArg(&local_1a0,name,(Type)local_1c0,fallback,description_08,opts);
  __l._M_len = 1;
  __l._M_array = &local_1a0;
  std::vector<RPCArg,_std::allocator<RPCArg>_>::vector(&local_a40,__l,&local_a41);
  local_330[0] = local_320;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_330,"");
  local_350[0] = local_340;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_350,"");
  local_6a0[0] = (pointer)local_690;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_6a0,"descriptor","");
  local_6c0[0] = local_6b0;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_6c0,
             "The descriptor in canonical form, without private keys. For a multipath descriptor, only the first will be returned."
             ,"");
  local_a98.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_a98.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_a98.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  m_key_name._M_dataplus._M_p._4_4_ = in_stack_fffffffffffff47c;
  m_key_name._M_dataplus._M_p._0_4_ = in_stack_fffffffffffff478;
  m_key_name._M_string_length = (size_type)in_RDI;
  m_key_name.field_2._M_allocated_capacity = in_stack_fffffffffffff488;
  m_key_name.field_2._8_8_ = in_stack_fffffffffffff490;
  description._M_string_length = in_stack_fffffffffffff4a0;
  description._M_dataplus._M_p = (pointer)in_stack_fffffffffffff498;
  description.field_2 = in_stack_fffffffffffff4a8;
  inner.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data.
  _M_finish = in_stack_fffffffffffff4c0;
  inner.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data.
  _M_start = in_stack_fffffffffffff4b8;
  inner.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = in_stack_fffffffffffff4c8;
  RPCResult::RPCResult
            ((RPCResult *)(local_690 + 0x10),STR,m_key_name,description,inner,SUB81(local_6a0,0));
  local_6e0.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_start =
       (pointer)((long)&local_6e0.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl
                + 0x10);
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_6e0,"multipath_expansion","");
  local_700[0] = local_6f0;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_700,
             "All descriptors produced by expanding multipath derivation elements. Only if the provided descriptor specifies multipath derivation elements."
             ,"");
  local_7a8[0] = local_798;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_7a8,"");
  local_7c8[0] = local_7b8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_7c8,"");
  m_key_name_00._M_dataplus._M_p._4_4_ = in_stack_fffffffffffff47c;
  m_key_name_00._M_dataplus._M_p._0_4_ = in_stack_fffffffffffff478;
  m_key_name_00._M_string_length = (size_type)in_RDI;
  m_key_name_00.field_2._M_allocated_capacity = in_stack_fffffffffffff488;
  m_key_name_00.field_2._8_8_ = in_stack_fffffffffffff490;
  description_00._M_string_length = in_stack_fffffffffffff4a0;
  description_00._M_dataplus._M_p = (pointer)in_stack_fffffffffffff498;
  description_00.field_2 = in_stack_fffffffffffff4a8;
  inner_00.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_finish = in_stack_fffffffffffff4c0;
  inner_00.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_start = in_stack_fffffffffffff4b8;
  inner_00.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = in_stack_fffffffffffff4c8;
  RPCResult::RPCResult(&local_788,STR,m_key_name_00,description_00,inner_00,SUB81(local_7a8,0));
  __l_00._M_len = 1;
  __l_00._M_array = &local_788;
  std::vector<RPCResult,_std::allocator<RPCResult>_>::vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)&stack0xfffffffffffff550,__l_00,
             (allocator_type *)&stack0xfffffffffffff537);
  uVar9 = 0;
  auVar3._4_8_ = in_RDI;
  auVar3._0_4_ = in_stack_fffffffffffff47c;
  auVar3._12_8_ = in_stack_fffffffffffff488;
  auVar3._20_8_ = in_stack_fffffffffffff490;
  auVar3._28_4_ = 0;
  description_01._M_string_length = in_stack_fffffffffffff4a0;
  description_01._M_dataplus._M_p = (pointer)in_stack_fffffffffffff498;
  description_01.field_2 = in_stack_fffffffffffff4a8;
  inner_01.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_finish = in_stack_fffffffffffff4c0;
  inner_01.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_start = in_stack_fffffffffffff4b8;
  inner_01.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = in_stack_fffffffffffff4c8;
  RPCResult::RPCResult
            (&local_5f8,ARR,(string)(auVar3 << 0x20),SUB81(&local_6e0,0),description_01,inner_01,
             true);
  local_7e8[0] = local_7d8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_7e8,"checksum","");
  local_808[0] = local_7f8;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_808,"The checksum for the input descriptor","");
  m_key_name_01._M_dataplus._M_p._4_4_ = in_stack_fffffffffffff47c;
  m_key_name_01._M_dataplus._M_p._0_4_ = uVar9;
  m_key_name_01._M_string_length = (size_type)in_RDI;
  m_key_name_01.field_2._M_allocated_capacity = in_stack_fffffffffffff488;
  m_key_name_01.field_2._8_8_ = in_stack_fffffffffffff490;
  description_02._M_string_length = in_stack_fffffffffffff4a0;
  description_02._M_dataplus._M_p = (pointer)in_stack_fffffffffffff498;
  description_02.field_2 = in_stack_fffffffffffff4a8;
  inner_02.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_finish = in_stack_fffffffffffff4c0;
  inner_02.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_start = in_stack_fffffffffffff4b8;
  inner_02.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = in_stack_fffffffffffff4c8;
  RPCResult::RPCResult(&local_570,STR,m_key_name_01,description_02,inner_02,SUB81(local_7e8,0));
  local_828[0] = local_818;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_828,"isrange","");
  local_848[0] = local_838;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_848,"Whether the descriptor is ranged","");
  pRVar17 = (pointer)0x0;
  pRVar18 = (pointer)0x0;
  m_key_name_02._M_dataplus._M_p._4_4_ = in_stack_fffffffffffff47c;
  m_key_name_02._M_dataplus._M_p._0_4_ = uVar9;
  m_key_name_02._M_string_length = (size_type)in_RDI;
  m_key_name_02.field_2._M_allocated_capacity = in_stack_fffffffffffff488;
  m_key_name_02.field_2._8_8_ = in_stack_fffffffffffff490;
  description_03._M_string_length = in_stack_fffffffffffff4a0;
  description_03._M_dataplus._M_p = (pointer)in_stack_fffffffffffff498;
  description_03.field_2 = in_stack_fffffffffffff4a8;
  inner_03.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_finish = in_stack_fffffffffffff4c0;
  inner_03.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_start = in_stack_fffffffffffff4b8;
  inner_03.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = in_stack_fffffffffffff4c8;
  RPCResult::RPCResult(&local_4e8,BOOL,m_key_name_02,description_03,inner_03,SUB81(local_828,0));
  local_868[0] = local_858;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_868,"issolvable","");
  local_888[0] = local_878;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_888,"Whether the descriptor is solvable","");
  pRVar14 = (pointer)0x0;
  pRVar15 = (pointer)0x0;
  pRVar16 = (pointer)0x0;
  m_key_name_03._M_dataplus._M_p._4_4_ = in_stack_fffffffffffff47c;
  m_key_name_03._M_dataplus._M_p._0_4_ = uVar9;
  m_key_name_03._M_string_length = (size_type)in_RDI;
  m_key_name_03.field_2._M_allocated_capacity = in_stack_fffffffffffff488;
  m_key_name_03.field_2._8_8_ = in_stack_fffffffffffff490;
  description_04._M_string_length = in_stack_fffffffffffff4a0;
  description_04._M_dataplus._M_p = (pointer)in_stack_fffffffffffff498;
  description_04.field_2 = in_stack_fffffffffffff4a8;
  inner_04.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_finish = in_stack_fffffffffffff4c0;
  inner_04.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_start = in_stack_fffffffffffff4b8;
  inner_04.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = in_stack_fffffffffffff4c8;
  RPCResult::RPCResult(&local_460,BOOL,m_key_name_03,description_04,inner_04,SUB81(local_868,0));
  local_8a8[0] = local_898;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_8a8,"hasprivatekeys","");
  local_8c8[0] = local_8b8;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_8c8,"Whether the input descriptor contained at least one private key",
             "");
  pRVar11 = (pointer)0x0;
  pRVar12 = (pointer)0x0;
  pRVar13 = (pointer)0x0;
  m_key_name_04._M_dataplus._M_p._4_4_ = in_stack_fffffffffffff47c;
  m_key_name_04._M_dataplus._M_p._0_4_ = uVar9;
  m_key_name_04._M_string_length = (size_type)in_RDI;
  m_key_name_04.field_2._M_allocated_capacity = in_stack_fffffffffffff488;
  m_key_name_04.field_2._8_8_ = in_stack_fffffffffffff490;
  description_05._M_string_length = in_stack_fffffffffffff4a0;
  description_05._M_dataplus._M_p = (pointer)in_stack_fffffffffffff498;
  description_05.field_2._M_local_buf = in_stack_fffffffffffff4a8._M_local_buf;
  inner_05.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = (pointer)0x0;
  inner_05.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_start = (pointer)0x0;
  inner_05.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_finish = (pointer)0x0;
  RPCResult::RPCResult(&local_3d8,BOOL,m_key_name_04,description_05,inner_05,SUB81(local_8a8,0));
  __l_01._M_len = 6;
  __l_01._M_array = (iterator)(local_690 + 0x10);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::vector
            (&local_a78,__l_01,(allocator_type *)&stack0xfffffffffffff4b7);
  m_key_name_05._M_dataplus._M_p._4_4_ = in_stack_fffffffffffff47c;
  m_key_name_05._M_dataplus._M_p._0_4_ = uVar9;
  m_key_name_05._M_string_length = (size_type)in_RDI;
  m_key_name_05.field_2._M_allocated_capacity = in_stack_fffffffffffff488;
  m_key_name_05.field_2._8_8_ = in_stack_fffffffffffff490;
  description_06._M_string_length = in_stack_fffffffffffff4a0;
  description_06._M_dataplus._M_p = (pointer)in_stack_fffffffffffff498;
  description_06.field_2 = in_stack_fffffffffffff4a8;
  inner_06.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_finish = pRVar12;
  inner_06.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_start = pRVar11;
  inner_06.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = (pointer)pRVar13;
  RPCResult::RPCResult(&local_310,OBJ,m_key_name_05,description_06,inner_06,SUB81(local_330,0));
  result._4_4_ = in_stack_fffffffffffff47c;
  result.m_type = uVar9;
  result.m_key_name._M_dataplus._M_p = (pointer)in_RDI;
  result.m_key_name._M_string_length = in_stack_fffffffffffff488;
  result.m_key_name.field_2._M_allocated_capacity = in_stack_fffffffffffff490;
  result.m_key_name.field_2._8_8_ = in_stack_fffffffffffff498;
  result.m_inner.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)in_stack_fffffffffffff4a0;
  result.m_inner.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._8_16_ = in_stack_fffffffffffff4a8;
  result._64_8_ = pRVar11;
  result.m_description._M_dataplus._M_p = (pointer)pRVar12;
  result.m_description._M_string_length = (size_type)pRVar13;
  result.m_description.field_2._M_allocated_capacity = in_stack_fffffffffffff4d0;
  result.m_description.field_2._8_8_ = pRVar14;
  result.m_cond._M_dataplus._M_p = (pointer)pRVar15;
  result.m_cond._M_string_length = (size_type)pRVar16;
  result.m_cond.field_2._M_allocated_capacity = in_stack_fffffffffffff4f0;
  result.m_cond.field_2._8_8_ = pRVar17;
  RPCResults::RPCResults(&local_a60,result);
  local_968._M_dataplus._M_p = (pointer)&local_968.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_968,"getdescriptorinfo","");
  std::operator+(&local_9a8,"\"",&local_58);
  pbVar4 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                     (&local_9a8,"\"");
  local_988._M_dataplus._M_p = (pointer)&local_988.field_2;
  paVar1 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)(pbVar4->_M_dataplus)._M_p;
  paVar5 = &pbVar4->field_2;
  if (paVar1 == paVar5) {
    local_988.field_2._M_allocated_capacity = paVar5->_M_allocated_capacity;
    local_988.field_2._8_8_ = *(undefined8 *)((long)&pbVar4->field_2 + 8);
  }
  else {
    local_988.field_2._M_allocated_capacity = paVar5->_M_allocated_capacity;
    local_988._M_dataplus._M_p = (pointer)paVar1;
  }
  local_988._M_string_length = pbVar4->_M_string_length;
  (pbVar4->_M_dataplus)._M_p = (pointer)paVar5;
  pbVar4->_M_string_length = 0;
  (pbVar4->field_2)._M_local_buf[0] = '\0';
  HelpExampleCli(&local_948,&local_968,&local_988);
  pbVar4 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::replace
                     (&local_948,0,0,"Analyse a descriptor\n",0x15);
  paVar1 = &local_928.field_2;
  local_928._M_dataplus._M_p = (pbVar4->_M_dataplus)._M_p;
  paVar5 = &pbVar4->field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_928._M_dataplus._M_p == paVar5) {
    local_928.field_2._M_allocated_capacity = paVar5->_M_allocated_capacity;
    local_928.field_2._8_4_ = *(undefined4 *)((long)&pbVar4->field_2 + 8);
    local_928.field_2._12_4_ = *(undefined4 *)((long)&pbVar4->field_2 + 0xc);
    local_928._M_dataplus._M_p = (pointer)paVar1;
  }
  else {
    local_928.field_2._M_allocated_capacity = paVar5->_M_allocated_capacity;
  }
  local_928._M_string_length = pbVar4->_M_string_length;
  (pbVar4->_M_dataplus)._M_p = (pointer)paVar5;
  pbVar4->_M_string_length = 0;
  (pbVar4->field_2)._M_local_buf[0] = '\0';
  local_9e8._M_dataplus._M_p = (pointer)&local_9e8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_9e8,"getdescriptorinfo","");
  std::operator+(&local_a28,"\"",&local_58);
  pbVar4 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                     (&local_a28,"\"");
  local_a08._M_dataplus._M_p = (pointer)&local_a08.field_2;
  paVar5 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)(pbVar4->_M_dataplus)._M_p;
  paVar6 = &pbVar4->field_2;
  if (paVar5 == paVar6) {
    local_a08.field_2._M_allocated_capacity = paVar6->_M_allocated_capacity;
    local_a08.field_2._8_8_ = *(undefined8 *)((long)&pbVar4->field_2 + 8);
  }
  else {
    local_a08.field_2._M_allocated_capacity = paVar6->_M_allocated_capacity;
    local_a08._M_dataplus._M_p = (pointer)paVar5;
  }
  local_a08._M_string_length = pbVar4->_M_string_length;
  (pbVar4->_M_dataplus)._M_p = (pointer)paVar6;
  pbVar4->_M_string_length = 0;
  (pbVar4->field_2)._M_local_buf[0] = '\0';
  HelpExampleRpc(&local_9c8,&local_9e8,&local_a08);
  uVar8 = 0xf;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_928._M_dataplus._M_p != paVar1) {
    uVar8 = local_928.field_2._M_allocated_capacity;
  }
  if ((ulong)uVar8 < local_9c8._M_string_length + local_928._M_string_length) {
    uVar8 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_9c8._M_dataplus._M_p != &local_9c8.field_2) {
      uVar8 = local_9c8.field_2._M_allocated_capacity;
    }
    if (local_9c8._M_string_length + local_928._M_string_length <= (ulong)uVar8) {
      pbVar4 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
               replace(&local_9c8,0,0,local_928._M_dataplus._M_p,local_928._M_string_length);
      goto LAB_00a5ca33;
    }
  }
  pbVar4 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
           _M_append(&local_928,local_9c8._M_dataplus._M_p,local_9c8._M_string_length);
LAB_00a5ca33:
  local_908 = &local_8f8;
  puVar2 = (ulong *)(pbVar4->_M_dataplus)._M_p;
  paVar5 = &pbVar4->field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)puVar2 == paVar5) {
    local_8f8 = paVar5->_M_allocated_capacity;
    uStack_8f0 = *(undefined8 *)((long)&pbVar4->field_2 + 8);
  }
  else {
    local_8f8 = paVar5->_M_allocated_capacity;
    local_908 = puVar2;
  }
  local_8e0 = pbVar4->_M_string_length;
  (pbVar4->_M_dataplus)._M_p = (pointer)paVar5;
  pbVar4->_M_string_length = 0;
  paVar5->_M_local_buf[0] = '\0';
  if (local_908 == &local_8f8) {
    uStack_8d0 = uStack_8f0;
    local_8e8 = &local_8d8;
  }
  else {
    local_8e8 = local_908;
  }
  local_8d8 = local_8f8;
  local_900 = 0;
  local_8f8 = local_8f8 & 0xffffffffffffff00;
  pcVar10 = std::
            _Function_handler<UniValue_(const_RPCHelpMan_&,_const_JSONRPCRequest_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/rpc/output_script.cpp:194:9)>
            ::_M_manager;
  description_07._M_string_length =
       (size_type)
       std::
       _Function_handler<UniValue_(const_RPCHelpMan_&,_const_JSONRPCRequest_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/rpc/output_script.cpp:194:9)>
       ::_M_invoke;
  description_07._M_dataplus._M_p =
       (pointer)std::
                _Function_handler<UniValue_(const_RPCHelpMan_&,_const_JSONRPCRequest_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/rpc/output_script.cpp:194:9)>
                ::_M_manager;
  description_07.field_2 = in_stack_fffffffffffff4a8;
  args.super__Vector_base<RPCArg,_std::allocator<RPCArg>_>._M_impl.super__Vector_impl_data._M_finish
       = (pointer)pRVar12;
  args.super__Vector_base<RPCArg,_std::allocator<RPCArg>_>._M_impl.super__Vector_impl_data._M_start
       = (pointer)pRVar11;
  args.super__Vector_base<RPCArg,_std::allocator<RPCArg>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = pRVar13;
  results.m_results.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_finish = pRVar14;
  results.m_results.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)in_stack_fffffffffffff4d0;
  results.m_results.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = pRVar15;
  examples.m_examples._M_string_length = in_stack_fffffffffffff4f0;
  examples.m_examples._M_dataplus._M_p = (pointer)pRVar16;
  examples.m_examples.field_2._M_allocated_capacity = (size_type)pRVar17;
  examples.m_examples.field_2._8_8_ = pRVar18;
  local_908 = &local_8f8;
  RPCHelpMan::RPCHelpMan
            (in_RDI,(string)ZEXT1632(CONCAT88(in_RDI,&stack0xfffffffffffff488)),description_07,args,
             results,examples,(RPCMethodImpl *)&local_78);
  if (pcVar10 != (code *)0x0) {
    (*pcVar10)(&stack0xfffffffffffff488,&stack0xfffffffffffff488,3);
  }
  if (local_8e8 != &local_8d8) {
    operator_delete(local_8e8,local_8d8 + 1);
  }
  if (local_908 != &local_8f8) {
    operator_delete(local_908,local_8f8 + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_9c8._M_dataplus._M_p != &local_9c8.field_2) {
    operator_delete(local_9c8._M_dataplus._M_p,local_9c8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a08._M_dataplus._M_p != &local_a08.field_2) {
    operator_delete(local_a08._M_dataplus._M_p,local_a08.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a28._M_dataplus._M_p != &local_a28.field_2) {
    operator_delete(local_a28._M_dataplus._M_p,local_a28.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_9e8._M_dataplus._M_p != &local_9e8.field_2) {
    operator_delete(local_9e8._M_dataplus._M_p,local_9e8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_928._M_dataplus._M_p != paVar1) {
    operator_delete(local_928._M_dataplus._M_p,local_928.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_948._M_dataplus._M_p != &local_948.field_2) {
    operator_delete(local_948._M_dataplus._M_p,local_948.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_988._M_dataplus._M_p != &local_988.field_2) {
    operator_delete(local_988._M_dataplus._M_p,local_988.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_9a8._M_dataplus._M_p != &local_9a8.field_2) {
    operator_delete(local_9a8._M_dataplus._M_p,local_9a8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_968._M_dataplus._M_p != &local_968.field_2) {
    operator_delete(local_968._M_dataplus._M_p,local_968.field_2._M_allocated_capacity + 1);
  }
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(&local_a60.m_results);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_310.m_cond._M_dataplus._M_p != &local_310.m_cond.field_2) {
    operator_delete(local_310.m_cond._M_dataplus._M_p,
                    local_310.m_cond.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_310.m_description._M_dataplus._M_p != &local_310.m_description.field_2) {
    operator_delete(local_310.m_description._M_dataplus._M_p,
                    local_310.m_description.field_2._M_allocated_capacity + 1);
  }
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(&local_310.m_inner);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_310.m_key_name._M_dataplus._M_p != &local_310.m_key_name.field_2) {
    operator_delete(local_310.m_key_name._M_dataplus._M_p,
                    local_310.m_key_name.field_2._M_allocated_capacity + 1);
  }
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(&local_a78);
  lVar7 = 0x330;
  do {
    if ((long *)(local_690 + lVar7) != *(long **)((long)local_6a0 + lVar7)) {
      operator_delete(*(long **)((long)local_6a0 + lVar7),*(long *)(local_690 + lVar7) + 1);
    }
    if ((long *)((long)local_6b0 + lVar7) != *(long **)((long)local_6c0 + lVar7)) {
      operator_delete(*(long **)((long)local_6c0 + lVar7),*(long *)((long)local_6b0 + lVar7) + 1);
    }
    std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
              ((vector<RPCResult,_std::allocator<RPCResult>_> *)
               ((long)&local_6e0.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl +
               lVar7));
    if ((long *)((long)local_6f0 + lVar7) != *(long **)((long)local_700 + lVar7)) {
      operator_delete(*(long **)((long)local_700 + lVar7),*(long *)((long)local_6f0 + lVar7) + 1);
    }
    lVar7 = lVar7 + -0x88;
  } while (lVar7 != 0);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)&stack0xfffffffffffff4b8);
  if (local_8c8[0] != local_8b8) {
    operator_delete(local_8c8[0],local_8b8[0] + 1);
  }
  if (local_8a8[0] != local_898) {
    operator_delete(local_8a8[0],local_898[0] + 1);
  }
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)&stack0xfffffffffffff4d8);
  if (local_888[0] != local_878) {
    operator_delete(local_888[0],local_878[0] + 1);
  }
  if (local_868[0] != local_858) {
    operator_delete(local_868[0],local_858[0] + 1);
  }
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)&stack0xfffffffffffff4f8);
  if (local_848[0] != local_838) {
    operator_delete(local_848[0],local_838[0] + 1);
  }
  if (local_828[0] != local_818) {
    operator_delete(local_828[0],local_818[0] + 1);
  }
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)&stack0xfffffffffffff518);
  if (local_808[0] != local_7f8) {
    operator_delete(local_808[0],local_7f8[0] + 1);
  }
  if (local_7e8[0] != local_7d8) {
    operator_delete(local_7e8[0],local_7d8[0] + 1);
  }
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)&stack0xfffffffffffff550);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_788.m_cond._M_dataplus._M_p != &local_788.m_cond.field_2) {
    operator_delete(local_788.m_cond._M_dataplus._M_p,
                    local_788.m_cond.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_788.m_description._M_dataplus._M_p != &local_788.m_description.field_2) {
    operator_delete(local_788.m_description._M_dataplus._M_p,
                    local_788.m_description.field_2._M_allocated_capacity + 1);
  }
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(&local_788.m_inner);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_788.m_key_name._M_dataplus._M_p != &local_788.m_key_name.field_2) {
    operator_delete(local_788.m_key_name._M_dataplus._M_p,
                    local_788.m_key_name.field_2._M_allocated_capacity + 1);
  }
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)&stack0xfffffffffffff538);
  if (local_7c8[0] != local_7b8) {
    operator_delete(local_7c8[0],local_7b8[0] + 1);
  }
  if (local_7a8[0] != local_798) {
    operator_delete(local_7a8[0],local_798[0] + 1);
  }
  if (local_700[0] != local_6f0) {
    operator_delete(local_700[0],local_6f0[0] + 1);
  }
  if (local_6e0.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
      super__Vector_impl_data._M_start !=
      (pointer)((long)&local_6e0.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl +
               0x10U)) {
    operator_delete(local_6e0.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (ulong)((long)&(local_6e0.
                                    super__Vector_base<RPCResult,_std::allocator<RPCResult>_>.
                                    _M_impl.super__Vector_impl_data._M_end_of_storage)->m_type + 1))
    ;
  }
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(&local_a98);
  if (local_6c0[0] != local_6b0) {
    operator_delete(local_6c0[0],local_6b0[0] + 1);
  }
  if (local_6a0[0] != (pointer)local_690) {
    operator_delete(local_6a0[0],local_690._0_8_ + 1);
  }
  if (local_350[0] != local_340) {
    operator_delete(local_350[0],local_340[0] + 1);
  }
  if (local_330[0] != local_320) {
    operator_delete(local_330[0],local_320[0] + 1);
  }
  std::vector<RPCArg,_std::allocator<RPCArg>_>::~vector(&local_a40);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_1a0.m_opts.type_str);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1a0.m_opts.oneline_description._M_dataplus._M_p !=
      &local_1a0.m_opts.oneline_description.field_2) {
    operator_delete(local_1a0.m_opts.oneline_description._M_dataplus._M_p,
                    local_1a0.m_opts.oneline_description.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1a0.m_description._M_dataplus._M_p != &local_1a0.m_description.field_2) {
    operator_delete(local_1a0.m_description._M_dataplus._M_p,
                    local_1a0.m_description.field_2._M_allocated_capacity + 1);
  }
  std::__detail::__variant::
  _Variant_storage<false,_RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  ::~_Variant_storage((_Variant_storage<false,_RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
                       *)&local_1a0.m_fallback);
  std::vector<RPCArg,_std::allocator<RPCArg>_>::~vector(&local_1a0.m_inner);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1a0.m_names._M_dataplus._M_p != &local_1a0.m_names.field_2) {
    operator_delete(local_1a0.m_names._M_dataplus._M_p,
                    local_1a0.m_names.field_2._M_allocated_capacity + 1);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_260);
  if (local_280 != &local_270) {
    operator_delete(local_280,CONCAT71(uStack_26f,local_270) + 1);
  }
  if (local_240[0] != local_230) {
    operator_delete(local_240[0],local_230[0] + 1);
  }
  std::__detail::__variant::
  _Variant_storage<false,_RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  ::~_Variant_storage((_Variant_storage<false,_RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
                       *)&local_220._M_first);
  if (local_1c0[0] != local_1b0) {
    operator_delete(local_1c0[0],local_1b0[0] + 1);
  }
  if (local_98[0] != local_88) {
    operator_delete(local_98[0],local_88[0] + 1);
  }
  if ((_Manager_type *)local_78._M_unused._0_8_ != local_68) {
    operator_delete(local_78._M_unused._M_object,(ulong)(local_68[0] + 1));
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_dataplus._M_p != &local_58.field_2) {
    operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return in_RDI;
  }
  __stack_chk_fail();
}

Assistant:

static RPCHelpMan getdescriptorinfo()
{
    const std::string EXAMPLE_DESCRIPTOR = "wpkh([d34db33f/84h/0h/0h]0279be667ef9dcbbac55a06295Ce870b07029Bfcdb2dce28d959f2815b16f81798)";

    return RPCHelpMan{"getdescriptorinfo",
        {"\nAnalyses a descriptor.\n"},
        {
            {"descriptor", RPCArg::Type::STR, RPCArg::Optional::NO, "The descriptor."},
        },
        RPCResult{
            RPCResult::Type::OBJ, "", "",
            {
                {RPCResult::Type::STR, "descriptor", "The descriptor in canonical form, without private keys. For a multipath descriptor, only the first will be returned."},
                {RPCResult::Type::ARR, "multipath_expansion", /*optional=*/true, "All descriptors produced by expanding multipath derivation elements. Only if the provided descriptor specifies multipath derivation elements.",
                {
                    {RPCResult::Type::STR, "", ""},
                }},
                {RPCResult::Type::STR, "checksum", "The checksum for the input descriptor"},
                {RPCResult::Type::BOOL, "isrange", "Whether the descriptor is ranged"},
                {RPCResult::Type::BOOL, "issolvable", "Whether the descriptor is solvable"},
                {RPCResult::Type::BOOL, "hasprivatekeys", "Whether the input descriptor contained at least one private key"},
            }
        },
        RPCExamples{
            "Analyse a descriptor\n" +
            HelpExampleCli("getdescriptorinfo", "\"" + EXAMPLE_DESCRIPTOR + "\"") +
            HelpExampleRpc("getdescriptorinfo", "\"" + EXAMPLE_DESCRIPTOR + "\"")
        },
        [&](const RPCHelpMan& self, const JSONRPCRequest& request) -> UniValue
        {
            FlatSigningProvider provider;
            std::string error;
            auto descs = Parse(request.params[0].get_str(), provider, error);
            if (descs.empty()) {
                throw JSONRPCError(RPC_INVALID_ADDRESS_OR_KEY, error);
            }

            UniValue result(UniValue::VOBJ);
            result.pushKV("descriptor", descs.at(0)->ToString());

            if (descs.size() > 1) {
                UniValue multipath_descs(UniValue::VARR);
                for (const auto& d : descs) {
                    multipath_descs.push_back(d->ToString());
                }
                result.pushKV("multipath_expansion", multipath_descs);
            }

            result.pushKV("checksum", GetDescriptorChecksum(request.params[0].get_str()));
            result.pushKV("isrange", descs.at(0)->IsRange());
            result.pushKV("issolvable", descs.at(0)->IsSolvable());
            result.pushKV("hasprivatekeys", provider.keys.size() > 0);
            return result;
        },
    };
}